

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pruned_grid.hpp
# Opt level: O3

spherical_grid_ptr __thiscall
IntegratorXX::detail::
make_pruned_grid_impl<IntegratorXX::Womersley<double>,IntegratorXX::RadialTransformQuadrature<IntegratorXX::GaussChebyshev2<double,double>,IntegratorXX::TreutlerAhlrichsRadialTraits>>
          (detail *this,
          RadialTransformQuadrature<IntegratorXX::GaussChebyshev2<double,_double>,_IntegratorXX::TreutlerAhlrichsRadialTraits>
          *rq,vector<IntegratorXX::PruningRegion,_std::allocator<IntegratorXX::PruningRegion>_>
              *pruning_regions)

{
  pointer pPVar1;
  size_t idx;
  element_type *peVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  pointer pPVar4;
  spherical_grid_ptr sVar5;
  RadialGridPartition<IntegratorXX::Womersley<double>_> rgp;
  AngularSize local_a8;
  element_type *local_a0;
  PrunedSphericalQuadrature<IntegratorXX::RadialTransformQuadrature<IntegratorXX::GaussChebyshev2<double,_double>,_IntegratorXX::TreutlerAhlrichsRadialTraits>,_IntegratorXX::Womersley<double>_>
  *local_98;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_90;
  long local_88;
  void *local_80;
  long local_70;
  RadialGridPartition<IntegratorXX::Womersley<double>_> local_68;
  
  local_68.quads_.
  super__Vector_base<IntegratorXX::Quadrature<IntegratorXX::Womersley<double>_>,_std::allocator<IntegratorXX::Quadrature<IntegratorXX::Womersley<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68.quads_.
  super__Vector_base<IntegratorXX::Quadrature<IntegratorXX::Womersley<double>_>,_std::allocator<IntegratorXX::Quadrature<IntegratorXX::Womersley<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_68.partition_idx_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_68.quads_.
  super__Vector_base<IntegratorXX::Quadrature<IntegratorXX::Womersley<double>_>,_std::allocator<IntegratorXX::Quadrature<IntegratorXX::Womersley<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.partition_idx_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.partition_idx_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  pPVar4 = (pruning_regions->
           super__Vector_base<IntegratorXX::PruningRegion,_std::allocator<IntegratorXX::PruningRegion>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pPVar1 = (pruning_regions->
           super__Vector_base<IntegratorXX::PruningRegion,_std::allocator<IntegratorXX::PruningRegion>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  local_a0 = (element_type *)this;
  if (pPVar4 != pPVar1) {
    do {
      idx = pPVar4->idx_st;
      local_a8 = pPVar4->angular_size;
      Quadrature<IntegratorXX::Womersley<double>>::Quadrature<unsigned_long&,void>
                ((Quadrature<IntegratorXX::Womersley<double>> *)&local_98,&local_a8);
      RadialGridPartition<IntegratorXX::Womersley<double>>::
      add_quad<IntegratorXX::RadialTransformQuadrature<IntegratorXX::GaussChebyshev2<double,double>,IntegratorXX::TreutlerAhlrichsRadialTraits>>
                ((RadialGridPartition<IntegratorXX::Womersley<double>> *)&local_68,rq,idx,
                 (Quadrature<IntegratorXX::Womersley<double>_> *)&local_98);
      if (local_80 != (void *)0x0) {
        operator_delete(local_80,local_70 - (long)local_80);
      }
      if (local_98 !=
          (PrunedSphericalQuadrature<IntegratorXX::RadialTransformQuadrature<IntegratorXX::GaussChebyshev2<double,_double>,_IntegratorXX::TreutlerAhlrichsRadialTraits>,_IntegratorXX::Womersley<double>_>
           *)0x0) {
        operator_delete(local_98,local_88 - (long)local_98);
      }
      pPVar4 = pPVar4 + 1;
    } while (pPVar4 != pPVar1);
  }
  RadialGridPartition<IntegratorXX::Womersley<double>>::
  finalize<IntegratorXX::RadialTransformQuadrature<IntegratorXX::GaussChebyshev2<double,double>,IntegratorXX::TreutlerAhlrichsRadialTraits>>
            ((RadialGridPartition<IntegratorXX::Womersley<double>> *)&local_68,rq);
  local_98 = (PrunedSphericalQuadrature<IntegratorXX::RadialTransformQuadrature<IntegratorXX::GaussChebyshev2<double,_double>,_IntegratorXX::TreutlerAhlrichsRadialTraits>,_IntegratorXX::Womersley<double>_>
              *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<IntegratorXX::PrunedSphericalQuadrature<IntegratorXX::RadialTransformQuadrature<IntegratorXX::GaussChebyshev2<double,double>,IntegratorXX::TreutlerAhlrichsRadialTraits>,IntegratorXX::Womersley<double>>,std::allocator<IntegratorXX::PrunedSphericalQuadrature<IntegratorXX::RadialTransformQuadrature<IntegratorXX::GaussChebyshev2<double,double>,IntegratorXX::TreutlerAhlrichsRadialTraits>,IntegratorXX::Womersley<double>>>,IntegratorXX::RadialTransformQuadrature<IntegratorXX::GaussChebyshev2<double,double>,IntegratorXX::TreutlerAhlrichsRadialTraits>const&,IntegratorXX::RadialGridPartition<IntegratorXX::Womersley<double>>>
            (&_Stack_90,&local_98,
             (allocator<IntegratorXX::PrunedSphericalQuadrature<IntegratorXX::RadialTransformQuadrature<IntegratorXX::GaussChebyshev2<double,_double>,_IntegratorXX::TreutlerAhlrichsRadialTraits>,_IntegratorXX::Womersley<double>_>_>
              *)&local_a8,rq,&local_68);
  peVar2 = local_a0;
  local_a0->_vptr_SphericalQuadratureBase = (_func_int **)local_98;
  (local_a0->center_)._M_elems[0] = (double)_Stack_90._M_pi;
  std::
  vector<IntegratorXX::Quadrature<IntegratorXX::Womersley<double>_>,_std::allocator<IntegratorXX::Quadrature<IntegratorXX::Womersley<double>_>_>_>
  ::~vector(&local_68.quads_);
  _Var3._M_pi = extraout_RDX;
  if (local_68.partition_idx_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_68.partition_idx_.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_68.partition_idx_.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_68.partition_idx_.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
    _Var3._M_pi = extraout_RDX_00;
  }
  sVar5.
  super___shared_ptr<IntegratorXX::SphericalQuadratureBase<std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>,_std::vector<double,_std::allocator<double>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = _Var3._M_pi;
  sVar5.
  super___shared_ptr<IntegratorXX::SphericalQuadratureBase<std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>,_std::vector<double,_std::allocator<double>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = peVar2;
  return (spherical_grid_ptr)
         sVar5.
         super___shared_ptr<IntegratorXX::SphericalQuadratureBase<std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>,_std::vector<double,_std::allocator<double>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

auto make_pruned_grid_impl(const RadialQuadType& rq, 
  const std::vector<PruningRegion>& pruning_regions) {

  RadialGridPartition<AngularQuadType> rgp;
  for( auto& region : pruning_regions ) {
    rgp.add_quad( rq, region.idx_st, AngularQuadType(region.angular_size) );
  }
  rgp.finalize(rq);

  return SphericalGridFactory::generate_pruned_grid(rq, std::move(rgp));

}